

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

GetShapeLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_getshape(NeuralNetworkLayer *this)

{
  GetShapeLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x429) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x429;
    this_00 = (GetShapeLayerParams *)operator_new(0x18);
    GetShapeLayerParams::GetShapeLayerParams(this_00);
    (this->layer_).getshape_ = this_00;
  }
  return (GetShapeLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::GetShapeLayerParams* NeuralNetworkLayer::mutable_getshape() {
  if (!has_getshape()) {
    clear_layer();
    set_has_getshape();
    layer_.getshape_ = new ::CoreML::Specification::GetShapeLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.getShape)
  return layer_.getshape_;
}